

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O2

int call_verify_cb(int ok,X509_STORE_CTX *ctx)

{
  uint uVar1;
  
  uVar1 = (*ctx->verify_cb)(ok,ctx);
  if (uVar1 < 2) {
    return uVar1;
  }
  abort();
}

Assistant:

static int call_verify_cb(int ok, X509_STORE_CTX *ctx) {
  ok = ctx->verify_cb(ok, ctx);
  // Historically, callbacks returning values like -1 would be treated as a mix
  // of success or failure. Insert that callers check correctly.
  //
  // TODO(davidben): Also use this wrapper to constrain which errors may be
  // suppressed, and ensure all |verify_cb| calls remember to fill in an error.
  BSSL_CHECK(ok == 0 || ok == 1);
  return ok;
}